

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl.c
# Opt level: O1

void yajl_free(yajl_handle handle)

{
  uchar *puVar1;
  yajl_alloc_funcs *pyVar2;
  
  puVar1 = (handle->stateStack).stack;
  if (puVar1 != (uchar *)0x0) {
    pyVar2 = (handle->stateStack).yaf;
    (*pyVar2->free)(pyVar2->ctx,puVar1);
  }
  yajl_buf_free(handle->decodeBuf);
  if (handle->lexer != (yajl_lexer)0x0) {
    yajl_lex_free(handle->lexer);
    handle->lexer = (yajl_lexer)0x0;
  }
  (*(handle->alloc).free)((handle->alloc).ctx,handle);
  return;
}

Assistant:

void
yajl_free(yajl_handle handle)
{
    yajl_bs_free(handle->stateStack);
    yajl_buf_free(handle->decodeBuf);
    if (handle->lexer) {
        yajl_lex_free(handle->lexer);
        handle->lexer = NULL;
    }
    YA_FREE(&(handle->alloc), handle);
}